

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O0

size_t absl::lts_20250127::cord_internal::anon_unknown_0::
       GetEstimatedUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                 (Nonnull<const_CordRep_*> rep)

{
  bool bVar1;
  CordRepCrc *pCVar2;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> local_28;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> repref;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> raw_usage;
  Nonnull<const_CordRep_*> rep_local;
  
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>::RawUsage
            ((RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> *)&repref)
  ;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>::CordRepRef
            (&local_28,rep);
  if ((local_28.rep)->tag == '\x02') {
    RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>::Add
              ((RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> *)
               &repref,0x20,local_28);
    pCVar2 = CordRep::crc(local_28.rep);
    if (pCVar2->child == (CordRep *)0x0) {
      return (size_t)repref.rep;
    }
    pCVar2 = CordRep::crc(local_28.rep);
    local_28 = CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>::Child
                         (&local_28,pCVar2->child);
  }
  bVar1 = IsDataEdge(local_28.rep);
  if (bVar1) {
    AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
              (local_28,(RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                         *)&repref);
  }
  else {
    if ((local_28.rep)->tag != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0xae,
                    "size_t absl::cord_internal::(anonymous namespace)::GetEstimatedUsage(absl::Nonnull<const CordRep *>) [mode = absl::cord_internal::(anonymous namespace)::Mode::kTotal]"
                   );
    }
    AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
              (local_28,(RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                         *)&repref);
  }
  return (size_t)repref.rep;
}

Assistant:

size_t GetEstimatedUsage(absl::Nonnull<const CordRep*> rep) {
  // Zero initialized memory usage totals.
  RawUsage<mode> raw_usage;

  // Capture top level node and refcount into a CordRepRef.
  CordRepRef<mode> repref(rep);

  // Consume the top level CRC node if present.
  if (repref.rep->tag == CRC) {
    raw_usage.Add(sizeof(CordRepCrc), repref);
    if (repref.rep->crc()->child == nullptr) {
      return static_cast<size_t>(raw_usage.total);
    }
    repref = repref.Child(repref.rep->crc()->child);
  }

  if (IsDataEdge(repref.rep)) {
    AnalyzeDataEdge(repref, raw_usage);
  } else if (repref.rep->tag == BTREE) {
    AnalyzeBtree(repref, raw_usage);
  } else {
    assert(false);
  }

  return static_cast<size_t>(raw_usage.total);
}